

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringFunctions.cpp
# Opt level: O2

string * IO::fileToString(string *__return_storage_ptr__,string *fileName)

{
  string fileInString;
  ifstream fin;
  undefined8 auStack_130 [36];
  
  std::ifstream::ifstream(&fin,(fileName->_M_dataplus)._M_p,_S_in);
  fileInString._M_dataplus._M_p = (pointer)&fileInString.field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&fileInString,*(undefined8 *)((long)auStack_130 + *(long *)(_fin + -0x18)),
             0xffffffffffffffff,0,0xffffffff);
  convertToCaps(__return_storage_ptr__,&fileInString);
  std::__cxx11::string::~string((string *)&fileInString);
  std::ifstream::~ifstream(&fin);
  return __return_storage_ptr__;
}

Assistant:

string
IO::fileToString(const string& fileName)
{
    ifstream fin(fileName.c_str(), ios::in);

    string fileInString((istreambuf_iterator<char>(fin)),
                         istreambuf_iterator<char>());

    return convertToCaps(fileInString);
}